

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O2

int AdvectionJac(sunrealtype c,SUNMatrix Jac,UserData udata)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar7 = udata->dx;
  dVar8 = (udata->au * -0.5) / dVar7;
  dVar9 = (udata->av * -0.5) / dVar7;
  dVar7 = (udata->aw * -0.5) / dVar7;
  lVar4 = udata->N + -1;
  lVar6 = 0x40;
  for (lVar5 = 1; lVar5 < lVar4; lVar5 = lVar5 + 1) {
    lVar1 = *(long *)((long)Jac->content + 0x28);
    lVar2 = *(long *)((long)Jac->content + 0x40);
    lVar3 = *(long *)(lVar2 + -0x40 + lVar6);
    *(double *)(lVar3 + 0x18 + lVar1 * 8) = *(double *)(lVar3 + 0x18 + lVar1 * 8) - dVar8;
    lVar3 = *(long *)(lVar2 + -0x38 + lVar6);
    *(double *)(lVar3 + 0x18 + lVar1 * 8) = *(double *)(lVar3 + 0x18 + lVar1 * 8) - dVar9;
    lVar3 = *(long *)(lVar2 + -0x30 + lVar6);
    *(double *)(lVar3 + 0x18 + lVar1 * 8) = *(double *)(lVar3 + 0x18 + lVar1 * 8) - dVar7;
    lVar3 = *(long *)(lVar2 + -0x10 + lVar6);
    *(double *)(lVar3 + -0x18 + lVar1 * 8) = *(double *)(lVar3 + -0x18 + lVar1 * 8) + dVar8;
    lVar3 = *(long *)(lVar2 + -8 + lVar6);
    *(double *)(lVar3 + -0x18 + lVar1 * 8) = *(double *)(lVar3 + -0x18 + lVar1 * 8) + dVar9;
    *(double *)(*(long *)(lVar2 + lVar6) + -0x18 + lVar1 * 8) =
         *(double *)(*(long *)(lVar2 + lVar6) + -0x18 + lVar1 * 8) + dVar7;
    lVar6 = lVar6 + 0x18;
  }
  return (int)lVar4;
}

Assistant:

static int AdvectionJac(sunrealtype c, SUNMatrix Jac, UserData udata)
{
  /* Set shortcuts */
  sunindextype N = udata->N;
  sunrealtype dx = udata->dx;
  sunrealtype au = udata->au;
  sunrealtype av = udata->av;
  sunrealtype aw = udata->aw;
  sunindextype i;
  sunrealtype auconst, avconst, awconst;
  auconst = -au / TWO / dx;
  avconst = -av / TWO / dx;
  awconst = -aw / TWO / dx;

  /* iterate over intervals, filling in Jacobian of (L*y) using SM_ELEMENT_B
     macro (see sunmatrix_band.h) */
  for (i = 1; i < N - 1; i++)
  {
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i - 1, 0)) += -c * auconst;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i - 1, 1)) += -c * avconst;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i - 1, 2)) += -c * awconst;
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i + 1, 0)) += c * auconst;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i + 1, 1)) += c * avconst;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i + 1, 2)) += c * awconst;
  }

  /* Return with success */
  return 0;
}